

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAllTargetsStoreCS::Run(BasicAllTargetsStoreCS *this)

{
  bool bVar1;
  Vector<unsigned_int,_4> local_198;
  Vector<unsigned_int,_4> local_188;
  Vector<int,_4> local_178;
  Vector<int,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vector<int,_4> local_138;
  Vector<int,_4> local_128;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<unsigned_int,_4> local_f8;
  Vector<unsigned_int,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<unsigned_int,_4> local_b8;
  Vector<unsigned_int,_4> local_a8;
  Vector<int,_4> local_98;
  Vector<int,_4> local_88;
  Vector<unsigned_int,_4> local_78;
  Vector<unsigned_int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllTargetsStoreCS *local_18;
  BasicAllTargetsStoreCS *this_local;
  
  local_18 = this;
  tcu::Vector<float,_4>::Vector(&local_28,-1.0,2.0,3.0,-4.0);
  tcu::Vector<float,_4>::Vector(&local_38,-1.0,2.0,3.0,-4.0);
  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStoreCS *)this,0,0x8814,&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<int,_4>::Vector(&local_48,1,-2,3,-4);
    tcu::Vector<int,_4>::Vector(&local_58,1,-2,3,-4);
    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                      ((BasicAllTargetsStoreCS *)this,0,0x8d82,&local_48,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_4>::Vector(&local_68,1,2,3,4);
      tcu::Vector<unsigned_int,_4>::Vector(&local_78,1,2,3,4);
      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
              Write<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsStoreCS *)this,0,0x8d70,&local_68,&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<int,_4>::Vector(&local_88,1,-2,3,-4);
        tcu::Vector<int,_4>::Vector(&local_98,1,-2,3,-4);
        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                          ((BasicAllTargetsStoreCS *)this,1,0x8d82,&local_88,&local_98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<unsigned_int,_4>::Vector(&local_a8,1,2,3,4);
          tcu::Vector<unsigned_int,_4>::Vector(&local_b8,1,2,3,4);
          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                  Write<tcu::Vector<unsigned_int,4>>
                            ((BasicAllTargetsStoreCS *)this,1,0x8d70,&local_a8,&local_b8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<float,_4>::Vector(&local_c8,-1.0,2.0,3.0,-4.0);
            tcu::Vector<float,_4>::Vector(&local_d8,-1.0,2.0,3.0,-4.0);
            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                    Write<tcu::Vector<float,4>>
                              ((BasicAllTargetsStoreCS *)this,1,0x8814,&local_c8,&local_d8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<unsigned_int,_4>::Vector(&local_e8,1,2,3,4);
              tcu::Vector<unsigned_int,_4>::Vector(&local_f8,1,2,3,4);
              bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                      Write<tcu::Vector<unsigned_int,4>>
                                ((BasicAllTargetsStoreCS *)this,2,0x8d70,&local_e8,&local_f8);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<float,_4>::Vector(&local_108,-1.0,2.0,3.0,-4.0);
                tcu::Vector<float,_4>::Vector(&local_118,-1.0,2.0,3.0,-4.0);
                bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                        Write<tcu::Vector<float,4>>
                                  ((BasicAllTargetsStoreCS *)this,2,0x8814,&local_108,&local_118);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<int,_4>::Vector(&local_128,1,-2,3,-4);
                  tcu::Vector<int,_4>::Vector(&local_138,1,-2,3,-4);
                  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                          Write<tcu::Vector<int,4>>
                                    ((BasicAllTargetsStoreCS *)this,2,0x8d82,&local_128,&local_138);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<float,_4>::Vector(&local_148,-1.0,2.0,3.0,-4.0);
                    tcu::Vector<float,_4>::Vector(&local_158,-1.0,2.0,3.0,-4.0);
                    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                            Write<tcu::Vector<float,4>>
                                      ((BasicAllTargetsStoreCS *)this,3,0x8814,&local_148,&local_158
                                      );
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<int,_4>::Vector(&local_168,1,-2,3,-4);
                      tcu::Vector<int,_4>::Vector(&local_178,1,-2,3,-4);
                      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                              Write<tcu::Vector<int,4>>
                                        ((BasicAllTargetsStoreCS *)this,3,0x8d82,&local_168,
                                         &local_178);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<unsigned_int,_4>::Vector(&local_188,1,2,3,4);
                        tcu::Vector<unsigned_int,_4>::Vector(&local_198,1,2,3,4);
                        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                                Write<tcu::Vector<unsigned_int,4>>
                                          ((BasicAllTargetsStoreCS *)this,3,0x8d70,&local_188,
                                           &local_198);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          this_local = (BasicAllTargetsStoreCS *)0x0;
                        }
                        else {
                          this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllTargetsStoreCS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		if (!Write(T2D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		return NO_ERROR;
	}